

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdm.hpp
# Opt level: O3

void __thiscall
wdm::Indep_test::Indep_test
          (Indep_test *this,vector<double,_std::allocator<double>_> *x,
          vector<double,_std::allocator<double>_> *y,string *method,
          vector<double,_std::allocator<double>_> *weights,bool remove_missing,string *alternative)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  pointer pcVar3;
  pointer pdVar4;
  pointer pdVar5;
  bool remove_missing_00;
  Indep_test *this_00;
  string *psVar6;
  vector<double,_std::allocator<double>_> *weights_00;
  int iVar7;
  long lVar8;
  runtime_error *this_01;
  size_type sVar9;
  long lVar10;
  long lVar11;
  undefined7 in_register_00000089;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  vector<double,_std::allocator<double>_> res;
  allocator_type local_199;
  vector<double,_std::allocator<double>_> *local_198;
  undefined8 uStack_190;
  double local_188;
  undefined8 uStack_180;
  Indep_test *local_170;
  string local_168;
  string *local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  string *local_130;
  vector<double,_std::allocator<double>_> *local_128;
  value_type_conflict local_120;
  vector<double,_std::allocator<double>_> local_118;
  vector<double,_std::allocator<double>_> local_100;
  vector<double,_std::allocator<double>_> local_e8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_198 = (vector<double,_std::allocator<double>_> *)
              CONCAT44(local_198._4_4_,(int)CONCAT71(in_register_00000089,remove_missing));
  paVar1 = &(this->method_).field_2;
  (this->method_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (method->_M_dataplus)._M_p;
  local_130 = method;
  local_128 = weights;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar3,pcVar3 + method->_M_string_length)
  ;
  psVar2 = &this->alternative_;
  local_140 = &(this->alternative_).field_2;
  (this->alternative_)._M_dataplus._M_p = (pointer)local_140;
  pcVar3 = (alternative->_M_dataplus)._M_p;
  local_170 = this;
  local_138 = paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)psVar2,pcVar3,pcVar3 + alternative->_M_string_length);
  weights_00 = local_128;
  psVar6 = local_130;
  lVar8 = (long)(y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
  local_148 = psVar2;
  if (lVar8 == (long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start) {
    pdVar4 = (local_128->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    pdVar5 = (local_128->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)pdVar4 - (long)pdVar5 == lVar8 || pdVar4 == pdVar5) {
      pcVar3 = (local_130->_M_dataplus)._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar3,pcVar3 + local_130->_M_string_length);
      remove_missing_00 = local_198._0_1_;
      local_198 = y;
      utils::preproc(&local_168,x,y,weights_00,&local_50,remove_missing_00);
      iVar7 = std::__cxx11::string::compare((char *)&local_168);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      this_00 = local_170;
      pdVar4 = (weights_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (weights_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (iVar7 == 0) {
        lVar8 = (long)pdVar5 - (long)pdVar4;
        if (lVar8 == 0) {
          lVar8 = (long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start;
          lVar10 = lVar8 >> 3;
          auVar14._8_4_ = (int)(lVar8 >> 0x23);
          auVar14._0_8_ = lVar10;
          auVar14._12_4_ = 0x45300000;
          local_198 = (vector<double,_std::allocator<double>_> *)
                      ((auVar14._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0));
        }
        else {
          sVar9 = lVar8 >> 3;
          local_198 = (vector<double,_std::allocator<double>_> *)0x0;
          lVar8 = 0;
          do {
            local_198 = (vector<double,_std::allocator<double>_> *)
                        ((double)local_198 + pdVar4[lVar8]);
            lVar8 = lVar8 + 1;
          } while (sVar9 + (sVar9 == 0) != lVar8);
          uStack_190 = 0;
          local_120 = 1.0;
          std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)&local_168,sVar9,&local_120,
                     &local_199);
          pdVar4 = (weights_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar8 = (long)(weights_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)pdVar4;
          if (lVar8 != 0) {
            lVar8 = lVar8 >> 3;
            lVar10 = 0;
            do {
              dVar12 = *(double *)(local_168._M_dataplus._M_p + lVar10 * 8);
              lVar11 = 2;
              do {
                dVar12 = dVar12 * pdVar4[lVar10];
                *(double *)(local_168._M_dataplus._M_p + lVar10 * 8) = dVar12;
                lVar11 = lVar11 + -1;
              } while (lVar11 != 0);
              lVar10 = lVar10 + 1;
            } while (lVar10 != lVar8 + (ulong)(lVar8 == 0));
          }
          if (local_168._M_string_length - (long)local_168._M_dataplus._M_p == 0) {
            local_198 = (vector<double,_std::allocator<double>_> *)
                        (((double)local_198 * (double)local_198) / 0.0);
            if (local_168._M_string_length == 0) goto LAB_00103819;
          }
          else {
            lVar8 = (long)(local_168._M_string_length - (long)local_168._M_dataplus._M_p) >> 3;
            dVar12 = 0.0;
            lVar10 = 0;
            do {
              dVar12 = dVar12 + *(double *)(local_168._M_dataplus._M_p + lVar10 * 8);
              lVar10 = lVar10 + 1;
            } while (lVar8 + (ulong)(lVar8 == 0) != lVar10);
            local_198 = (vector<double,_std::allocator<double>_> *)
                        (((double)local_198 * (double)local_198) / dVar12);
          }
          operator_delete(local_168._M_dataplus._M_p);
        }
LAB_00103819:
        this_00->n_eff_ = (double)local_198;
        this_00->estimate_ = NAN;
        this_00->statistic_ = NAN;
        this_00->p_value_ = NAN;
        return;
      }
      lVar8 = (long)pdVar5 - (long)pdVar4;
      if (lVar8 == 0) {
        lVar8 = (long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start;
        lVar10 = lVar8 >> 3;
        auVar13._8_4_ = (int)(lVar8 >> 0x23);
        auVar13._0_8_ = lVar10;
        auVar13._12_4_ = 0x45300000;
        dVar12 = (auVar13._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0);
      }
      else {
        sVar9 = lVar8 >> 3;
        local_188 = 0.0;
        lVar8 = 0;
        do {
          local_188 = local_188 + pdVar4[lVar8];
          lVar8 = lVar8 + 1;
        } while (sVar9 + (sVar9 == 0) != lVar8);
        uStack_180 = 0;
        local_120 = 1.0;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)&local_168,sVar9,&local_120,&local_199
                  );
        pdVar4 = (weights_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar8 = (long)(weights_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)pdVar4;
        if (lVar8 != 0) {
          lVar8 = lVar8 >> 3;
          lVar10 = 0;
          do {
            dVar12 = *(double *)(local_168._M_dataplus._M_p + lVar10 * 8);
            lVar11 = 2;
            do {
              dVar12 = dVar12 * pdVar4[lVar10];
              *(double *)(local_168._M_dataplus._M_p + lVar10 * 8) = dVar12;
              lVar11 = lVar11 + -1;
            } while (lVar11 != 0);
            lVar10 = lVar10 + 1;
          } while (lVar10 != lVar8 + (ulong)(lVar8 == 0));
        }
        if (local_168._M_string_length - (long)local_168._M_dataplus._M_p == 0) {
          dVar12 = (local_188 * local_188) / 0.0;
          if (local_168._M_string_length == 0) goto LAB_001035e7;
        }
        else {
          lVar8 = (long)(local_168._M_string_length - (long)local_168._M_dataplus._M_p) >> 3;
          dVar12 = 0.0;
          lVar10 = 0;
          do {
            dVar12 = dVar12 + *(double *)(local_168._M_dataplus._M_p + lVar10 * 8);
            lVar10 = lVar10 + 1;
          } while (lVar8 + (ulong)(lVar8 == 0) != lVar10);
          dVar12 = (local_188 * local_188) / dVar12;
        }
        local_188 = dVar12;
        operator_delete(local_168._M_dataplus._M_p);
        dVar12 = local_188;
      }
LAB_001035e7:
      this_00->n_eff_ = dVar12;
      std::vector<double,_std::allocator<double>_>::vector(&local_e8,x);
      std::vector<double,_std::allocator<double>_>::vector(&local_100,local_198);
      pcVar3 = (psVar6->_M_dataplus)._M_p;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar3,pcVar3 + psVar6->_M_string_length);
      std::vector<double,_std::allocator<double>_>::vector(&local_118,weights_00);
      dVar12 = wdm(&local_e8,&local_100,&local_70,&local_118,false);
      this_00->estimate_ = dVar12;
      if (local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_188 = this_00->estimate_;
      pcVar3 = (psVar6->_M_dataplus)._M_p;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar3,pcVar3 + psVar6->_M_string_length);
      dVar12 = compute_test_stat(this_00,local_188,&local_90,this_00->n_eff_,x,local_198,weights_00)
      ;
      this_00->statistic_ = dVar12;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
        dVar12 = this_00->statistic_;
      }
      pcVar3 = (psVar6->_M_dataplus)._M_p;
      local_198 = (vector<double,_std::allocator<double>_> *)dVar12;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar3,pcVar3 + psVar6->_M_string_length);
      pcVar3 = (alternative->_M_dataplus)._M_p;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,pcVar3,pcVar3 + alternative->_M_string_length);
      dVar12 = compute_p_value(this_00,(double)local_198,&local_b0,&local_d0,this_00->n_eff_);
      this_00->p_value_ = dVar12;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      return;
    }
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"x, y, and weights must have the same size.");
  }
  else {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"x and y must have the same size.");
  }
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Indep_test(std::vector<double> x,
               std::vector<double> y,
               std::string method,
               std::vector<double> weights = std::vector<double>(),
               bool remove_missing = true,
               std::string alternative = "two-sided") :
        method_(method),
        alternative_(alternative)
    {
        utils::check_sizes(x, y, weights);
        if (utils::preproc(x, y, weights, method, remove_missing) == "return_nan") {
            n_eff_ = utils::effective_sample_size(x.size(), weights);
            estimate_  = std::numeric_limits<double>::quiet_NaN();
            statistic_ = std::numeric_limits<double>::quiet_NaN();
            p_value_   = std::numeric_limits<double>::quiet_NaN();
        } else {
            n_eff_ = utils::effective_sample_size(x.size(), weights);
            estimate_ = wdm(x, y, method, weights, false);
            statistic_ = compute_test_stat(estimate_, method, n_eff_, x, y, weights);
            p_value_ = compute_p_value(statistic_, method, alternative, n_eff_);
        }
    }